

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void TestEq<float,int>(float expval,int val,char *exp,char *file,int line)

{
  string expval_str;
  string val_str;
  string local_60;
  string local_40;
  
  if (((float)val == expval) && (!NAN((float)val) && !NAN(expval))) {
    return;
  }
  flatbuffers::NumToString<float>(&local_60,expval);
  flatbuffers::NumToString<int>(&local_40,val);
  printf("TEST FAILED: %s:%d, %s (%s) != %s",file,(ulong)(uint)line,exp,local_60._M_dataplus._M_p,
         local_40._M_dataplus._M_p);
  putchar(10);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
                ,0x2d,"void TestEq(T, U, const char *, const char *, int) [T = float, U = int]");
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line) {
  if (expval != val) {
    auto expval_str = flatbuffers::NumToString(expval);
    auto val_str = flatbuffers::NumToString(val);
    TEST_OUTPUT_LINE("TEST FAILED: %s:%d, %s (%s) != %s", file, line,
                     exp, expval_str.c_str(), val_str.c_str());
    assert(0);
    testing_fails++;
  }
}